

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O2

void t24(void)

{
  char cVar1;
  undefined8 uVar2;
  int pos;
  char str [12];
  ALLEGRO_USTR_INFO info;
  
  str[0] = 'a';
  str[1] = '\0';
  str[2] = -0x3d;
  str[3] = -0x42;
  str[4] = -0x1e;
  str[5] = -0x7e;
  str[6] = -0x54;
  str[7] = -0xc;
  str[8] = -0x71;
  str[9] = -0x41;
  str[10] = -0x41;
  str[0xb] = '\0';
  uVar2 = al_ref_buffer(&info,str,0xb);
  pos = 0;
  cVar1 = al_ustr_next(uVar2);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (pos == 1) {
    log_printf("OK   %s\n","pos == 1");
  }
  else {
    log_printf("FAIL %s\n","pos == 1");
    error = error + 1;
  }
  cVar1 = al_ustr_next(uVar2,&pos);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (pos == 2) {
    log_printf("OK   %s\n","pos == 2");
  }
  else {
    log_printf("FAIL %s\n","pos == 2");
    error = error + 1;
  }
  cVar1 = al_ustr_next(uVar2,&pos);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (pos == 4) {
    log_printf("OK   %s\n","pos == 4");
  }
  else {
    log_printf("FAIL %s\n","pos == 4");
    error = error + 1;
  }
  cVar1 = al_ustr_next(uVar2,&pos);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (pos == 7) {
    log_printf("OK   %s\n","pos == 7");
  }
  else {
    log_printf("FAIL %s\n","pos == 7");
    error = error + 1;
  }
  cVar1 = al_ustr_next(uVar2,&pos);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (pos == 0xb) {
    log_printf("OK   %s\n","pos == 11");
  }
  else {
    log_printf("FAIL %s\n","pos == 11");
    error = error + 1;
  }
  cVar1 = al_ustr_next(uVar2,&pos);
  if (cVar1 == '\0') {
    log_printf("OK   %s\n","! al_ustr_next(us, &pos)");
  }
  else {
    log_printf("FAIL %s\n","! al_ustr_next(us, &pos)");
    error = error + 1;
  }
  if (pos == 0xb) {
    log_printf("OK   %s\n","pos == 11");
  }
  else {
    log_printf("FAIL %s\n","pos == 11");
    error = error + 1;
  }
  return;
}

Assistant:

static void t24(void)
{
   const char str[] = "a\0þ€\xf4\x8f\xbf\xbf";
   ALLEGRO_USTR_INFO info;
   const ALLEGRO_USTR *us = al_ref_buffer(&info, str, sizeof(str) - 1);
   int pos = 0;

   CHECK(al_ustr_next(us, &pos));   /* a */
   CHECK(pos == 1);

   CHECK(al_ustr_next(us, &pos));   /* NUL */
   CHECK(pos == 2);

   CHECK(al_ustr_next(us, &pos));   /* þ */
   CHECK(pos == 4);

   CHECK(al_ustr_next(us, &pos));   /* € */
   CHECK(pos == 7);

   CHECK(al_ustr_next(us, &pos));   /* U+10FFFF */
   CHECK(pos == 11);

   CHECK(! al_ustr_next(us, &pos)); /* end */
   CHECK(pos == 11);
}